

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O3

void WebPSamplerProcessPlane
               (uint8_t *y,int y_stride,uint8_t *u,uint8_t *v,int uv_stride,uint8_t *dst,
               int dst_stride,int width,int height,WebPSamplerRowFunc func)

{
  uint uVar1;
  uint uVar2;
  
  if (0 < height) {
    uVar2 = 0;
    do {
      (*func)(y,u,v,dst,width);
      y = y + y_stride;
      uVar1 = -(uVar2 & 1) & uv_stride;
      v = v + (int)uVar1;
      u = u + (int)uVar1;
      dst = dst + dst_stride;
      uVar2 = uVar2 + 1;
    } while (height != uVar2);
  }
  return;
}

Assistant:

void WebPSamplerProcessPlane(const uint8_t* y, int y_stride,
                             const uint8_t* u, const uint8_t* v, int uv_stride,
                             uint8_t* dst, int dst_stride,
                             int width, int height, WebPSamplerRowFunc func) {
  int j;
  for (j = 0; j < height; ++j) {
    func(y, u, v, dst, width);
    y += y_stride;
    if (j & 1) {
      u += uv_stride;
      v += uv_stride;
    }
    dst += dst_stride;
  }
}